

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenLiteral * toBinaryenLiteral(BinaryenLiteral *__return_storage_ptr__,Literal *x)

{
  bool bVar1;
  BasicType BVar2;
  int32_t iVar3;
  BasicHeapType BVar4;
  TypeID TVar5;
  int64_t iVar6;
  int64_t *piVar7;
  const_pointer pvVar8;
  BinaryenLiteral *ret;
  HeapType local_18;
  HeapType heapType;
  Literal *x_local;
  
  heapType.id = (uintptr_t)x;
  TVar5 = wasm::Type::getID(&x->type);
  __return_storage_ptr__->type = TVar5;
  bVar1 = wasm::Type::isSingle(&x->type);
  if (!bVar1) {
    __assert_fail("x.type.isSingle()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x37,"BinaryenLiteral toBinaryenLiteral(Literal)");
  }
  bVar1 = wasm::Type::isBasic(&x->type);
  if (bVar1) {
    BVar2 = wasm::Type::getBasic(&x->type);
    switch(BVar2) {
    case none:
    case unreachable:
      wasm::handle_unreachable
                ("unexpected type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                 ,0x4b);
    case i32:
      iVar3 = wasm::Literal::geti32(x);
      (__return_storage_ptr__->field_1).i32 = iVar3;
      break;
    case i64:
      iVar6 = wasm::Literal::geti64(x);
      (__return_storage_ptr__->field_1).i64 = iVar6;
      break;
    case f32:
      iVar3 = wasm::Literal::reinterpreti32(x);
      (__return_storage_ptr__->field_1).i32 = iVar3;
      break;
    case f64:
      iVar6 = wasm::Literal::reinterpreti64(x);
      (__return_storage_ptr__->field_1).i64 = iVar6;
      break;
    case v128:
      piVar7 = (int64_t *)wasm::Literal::getv128Ptr(x);
      (__return_storage_ptr__->field_1).i64 = *piVar7;
      *(int64_t *)((long)&__return_storage_ptr__->field_1 + 8) = piVar7[1];
      break;
    default:
      goto switchD_026ec1aa_default;
    }
  }
  else {
switchD_026ec1aa_default:
    bVar1 = wasm::Type::isRef(&x->type);
    if (!bVar1) {
      __assert_fail("x.type.isRef()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                    ,0x4e,"BinaryenLiteral toBinaryenLiteral(Literal)");
    }
    local_18 = wasm::Type::getHeapType(&x->type);
    bVar1 = wasm::HeapType::isBasic(&local_18);
    if (bVar1) {
      BVar4 = wasm::HeapType::getBasic(&local_18,Unshared);
      switch(BVar4) {
      case ext:
        wasm::handle_unreachable
                  ("TODO: extern literals",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x55);
      default:
        break;
      case func:
      case cont:
      case any:
      case eq:
      case struct_:
      case array:
      case exn:
        wasm::handle_unreachable
                  ("invalid type",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x5d);
      case i31:
        wasm::handle_unreachable
                  ("TODO: i31",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x53);
      case string:
        wasm::handle_unreachable
                  ("TODO: string literals",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x5f);
      case none:
      case noext:
      case nofunc:
      case nocont:
      case noexn:
        return __return_storage_ptr__;
      }
    }
    bVar1 = wasm::HeapType::isSignature(&local_18);
    if (!bVar1) {
      bVar1 = wasm::Literal::isData(x);
      if (bVar1) {
        wasm::handle_unreachable
                  ("TODO: gc data",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                   ,0x6e);
      }
      __assert_fail("x.isData()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                    ,0x6d,"BinaryenLiteral toBinaryenLiteral(Literal)");
    }
    _ret = (string_view)wasm::Literal::getFunc(x);
    pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&ret);
    (__return_storage_ptr__->field_1).func = pvVar8;
  }
  return __return_storage_ptr__;
}

Assistant:

BinaryenLiteral toBinaryenLiteral(Literal x) {
  BinaryenLiteral ret;
  ret.type = x.type.getID();
  assert(x.type.isSingle());
  if (x.type.isBasic()) {
    switch (x.type.getBasic()) {
      case Type::i32:
        ret.i32 = x.geti32();
        return ret;
      case Type::i64:
        ret.i64 = x.geti64();
        return ret;
      case Type::f32:
        ret.i32 = x.reinterpreti32();
        return ret;
      case Type::f64:
        ret.i64 = x.reinterpreti64();
        return ret;
      case Type::v128:
        memcpy(&ret.v128, x.getv128Ptr(), 16);
        return ret;
      case Type::none:
      case Type::unreachable:
        WASM_UNREACHABLE("unexpected type");
    }
  }
  assert(x.type.isRef());
  auto heapType = x.type.getHeapType();
  if (heapType.isBasic()) {
    switch (heapType.getBasic(Unshared)) {
      case HeapType::i31:
        WASM_UNREACHABLE("TODO: i31");
      case HeapType::ext:
        WASM_UNREACHABLE("TODO: extern literals");
      case HeapType::any:
      case HeapType::eq:
      case HeapType::func:
      case HeapType::cont:
      case HeapType::struct_:
      case HeapType::array:
      case HeapType::exn:
        WASM_UNREACHABLE("invalid type");
      case HeapType::string:
        WASM_UNREACHABLE("TODO: string literals");
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
      case HeapType::nocont:
      case HeapType::noexn:
        // Null.
        return ret;
    }
  }
  if (heapType.isSignature()) {
    ret.func = x.getFunc().str.data();
    return ret;
  }
  assert(x.isData());
  WASM_UNREACHABLE("TODO: gc data");
}